

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonparser.cpp
# Opt level: O0

bool json_parse(uint8_t *buf,size_t len,ParsedJson *pj,bool reallocifneeded)

{
  bool bVar1;
  bool bVar2;
  ostream *this;
  void *this_00;
  ulong uVar3;
  char *__dest;
  byte in_CL;
  ulong *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  bool isok;
  uint8_t *tmpbuf;
  long pagesize;
  bool reallocated;
  ParsedJson *in_stack_000000e0;
  size_t in_stack_000000e8;
  uint8_t *in_stack_000000f0;
  ParsedJson *in_stack_00000870;
  size_t in_stack_00000878;
  uint8_t *in_stack_00000880;
  bool local_1;
  
  if (*in_RDX < in_RSI) {
    this = std::operator<<((ostream *)&std::cerr,
                           "Your ParsedJson cannot support documents that big: ");
    this_00 = (void *)std::ostream::operator<<(this,in_RSI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    bVar1 = false;
    if (((in_CL & 1) != 0) && (uVar3 = sysconf(0x1e), ((long)in_RDI + (in_RSI - 1)) % uVar3 < 0x20))
    {
      __dest = allocate_padded_buffer((size_t)in_RDI);
      if (__dest == (char *)0x0) {
        return false;
      }
      memcpy(__dest,in_RDI,in_RSI);
      bVar1 = true;
    }
    bVar2 = find_structural_bits(in_stack_00000880,in_stack_00000878,in_stack_00000870);
    if (bVar2) {
      local_1 = unified_machine(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      if (bVar1) {
        aligned_free((void *)0x108377);
      }
    }
    else {
      if (bVar1) {
        aligned_free((void *)0x10835f);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

WARN_UNUSED
bool json_parse(const uint8_t *buf, size_t len, ParsedJson &pj, bool reallocifneeded) {
  if (pj.bytecapacity < len) {
    std::cerr << "Your ParsedJson cannot support documents that big: " << len
              << std::endl;
    return false;
  }
  bool reallocated = false;
  if(reallocifneeded) {
      // realloc is needed if the end of the memory crosses a page
#ifdef _MSC_VER
	  SYSTEM_INFO sysInfo; 
	  GetSystemInfo(&sysInfo); 
	  long pagesize = sysInfo.dwPageSize;
#else
     long pagesize = sysconf (_SC_PAGESIZE); 
#endif
	 if ( (reinterpret_cast<uintptr_t>(buf + len - 1) % pagesize ) < SIMDJSON_PADDING ) {
       const uint8_t *tmpbuf  = buf;
       buf = reinterpret_cast<uint8_t *>(allocate_padded_buffer(len));
       if(buf == nullptr) { return false;
}
       memcpy((void*)buf,tmpbuf,len);
       reallocated = true;
     }
  }
  bool isok = find_structural_bits(buf, len, pj);
  if (isok) {
    isok = unified_machine(buf, len, pj);
  } else {
    if(reallocated) { aligned_free((void*)buf);
}
    return false;
  }
  if(reallocated) { aligned_free((void*)buf);
}
  return isok;
}